

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void EndVisitBlock(ParseNodeBlock *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  byte bVar1;
  Scope *pSVar2;
  FuncInfo *this;
  ParseableFunctionInfo *pPVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  FunctionInfo *pFVar7;
  
  bVar5 = BlockHasOwnScope(pnode,byteCodeGenerator);
  if (bVar5) {
    pSVar2 = pnode->scope;
    bVar1 = byteCodeGenerator->m_utf8SourceInfo->field_0xa8;
    if ((byte)((bVar1 >> 5 |
               (byteCodeGenerator->m_utf8SourceInfo->debugModeSource).ptr != (uchar *)0x0) &
              (bVar1 & 0x40) >> 6) == 0) {
      this = pSVar2->func;
      pPVar3 = this->byteCodeFunction;
      pFVar7 = (pPVar3->super_FunctionProxy).functionInfo.ptr;
      if (pFVar7 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar5) goto LAB_0081fdee;
        *puVar6 = 0;
        pFVar7 = (pPVar3->super_FunctionProxy).functionInfo.ptr;
      }
      if ((ParseableFunctionInfo *)(pFVar7->functionBodyImpl).ptr != pPVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                           "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar5) goto LAB_0081fdee;
        *puVar6 = 0;
        pFVar7 = (pPVar3->super_FunctionProxy).functionInfo.ptr;
      }
      if (((pFVar7->attributes & (Async|Generator)) == None) &&
         (pSVar2->innerScopeIndex != 0xffffffff)) {
        if (pSVar2->innerScopeIndex != this->currentInnerScopeIndex) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x80,"(scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex())"
                             ,"scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex()");
          if (!bVar5) goto LAB_0081fdee;
          *puVar6 = 0;
        }
        FuncInfo::ReleaseInnerScopeIndex(this);
      }
    }
    if (byteCodeGenerator->currentScope != pSVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x84,"(byteCodeGenerator->GetCurrentScope() == scope)",
                         "byteCodeGenerator->GetCurrentScope() == scope");
      if (!bVar5) {
LAB_0081fdee:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar6 = 0;
    }
    ByteCodeGenerator::PopScope(byteCodeGenerator);
    byteCodeGenerator->currentBlock = byteCodeGenerator->currentBlock->enclosingBlock;
  }
  return;
}

Assistant:

void EndVisitBlock(ParseNodeBlock *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    if (BlockHasOwnScope(pnode, byteCodeGenerator))
    {
        Scope *scope = pnode->scope;
        FuncInfo *func = scope->GetFunc();

        if (!(byteCodeGenerator->IsInDebugMode() || func->byteCodeFunction->IsCoroutine())
            && scope->HasInnerScopeIndex())
        {
            // In debug mode (or for the generator/async function), don't release the current index, as we're giving each scope a unique index, regardless
            // of nesting.
            Assert(scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex());
            func->ReleaseInnerScopeIndex();
        }

        Assert(byteCodeGenerator->GetCurrentScope() == scope);
        byteCodeGenerator->PopScope();
        byteCodeGenerator->PopBlock();
    }
}